

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

ndarray __thiscall SpikesConsumer_python::create_numpy_array(SpikesConsumer_python *this)

{
  list *in_RSI;
  PyObject *in_RDI;
  list l;
  object_base this_00;
  dtype *in_stack_ffffffffffffff90;
  object_base in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  object_base in_stack_ffffffffffffffa8;
  numpy local_50 [16];
  char (*in_stack_ffffffffffffffc0) [3];
  char (*in_stack_ffffffffffffffc8) [10];
  char (*in_stack_ffffffffffffffd0) [4];
  char (*in_stack_ffffffffffffffd8) [9];
  
  this_00.m_ptr = in_RDI;
  boost::python::list::list((list *)0x392e04);
  boost::python::make_tuple<char[9],char[3]>
            ((char (*) [9])in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  boost::python::list::append<boost::python::tuple>
            ((list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (tuple *)in_stack_ffffffffffffff98.m_ptr);
  boost::python::tuple::~tuple((tuple *)0x392e39);
  boost::python::make_tuple<char[8],char[3]>
            ((char (*) [8])in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  boost::python::list::append<boost::python::tuple>
            ((list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (tuple *)in_stack_ffffffffffffff98.m_ptr);
  boost::python::tuple::~tuple((tuple *)0x392e6e);
  boost::python::make_tuple<char[10],char[3]>(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  boost::python::list::append<boost::python::tuple>
            ((list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (tuple *)in_stack_ffffffffffffff98.m_ptr);
  boost::python::tuple::~tuple((tuple *)0x392ea3);
  boost::python::make_tuple<char[9],char[4],int>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(int *)in_stack_ffffffffffffffc8);
  boost::python::list::append<boost::python::tuple>
            ((list *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (tuple *)in_stack_ffffffffffffff98.m_ptr);
  boost::python::tuple::~tuple((tuple *)0x392ee4);
  boost::python::make_tuple<int>((int *)in_stack_ffffffffffffffa8.m_ptr);
  boost::python::list::list((list *)this_00.m_ptr,(list *)in_RDI);
  boost::python::numpy::dtype::dtype<boost::python::list>
            (in_stack_ffffffffffffff90,in_RSI,SUB81((ulong)this_00.m_ptr >> 0x38,0));
  boost::python::numpy::zeros
            (local_50,(tuple *)&stack0xffffffffffffffa8,(dtype *)&stack0xffffffffffffff98);
  boost::python::numpy::ndarray::operator=((ndarray *)this_00.m_ptr,(ndarray *)in_RDI);
  boost::python::numpy::ndarray::~ndarray((ndarray *)0x392f59);
  boost::python::numpy::dtype::~dtype((dtype *)0x392f63);
  boost::python::list::~list((list *)0x392f6d);
  boost::python::tuple::~tuple((tuple *)0x392f77);
  boost::python::numpy::ndarray::ndarray((ndarray *)this_00.m_ptr,(ndarray *)in_RDI);
  boost::python::list::~list((list *)0x392f98);
  return (ndarray)this_00.m_ptr;
}

Assistant:

np::ndarray create_numpy_array(){
        //x = np.zeros(1, dtype='int32, int32, uint32, npint16')
        list l;
        l.append(boost::python::make_tuple("ntrodeid", "i4"));
        l.append(boost::python::make_tuple("cluster", "i4"));
        l.append(boost::python::make_tuple("timestamp", "u4"));
        l.append(boost::python::make_tuple("waveform", "2i2",maxpoints));
        spikearray = np::zeros(boost::python::make_tuple(1), np::dtype(l));
        return spikearray;
    }